

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_algo_struct.c
# Opt level: O3

void pl_report(pl_t *pl)

{
  err_msg(ERR_INFO,(char *)0x0,0,"Initialization of pl_t, report:\n");
  err_msg(ERR_INFO,(char *)0x0,0,"Parameters used in phoneme lookahead:\n");
  err_msg(ERR_INFO,(char *)0x0,0,"Phoneme look-ahead        type = %d\n",(ulong)(uint)pl->pheurtype)
  ;
  err_msg(ERR_INFO,(char *)0x0,0,"Phoneme look-ahead beam   size = %d\n",(ulong)(uint)pl->pl_beam);
  err_msg(ERR_INFO,(char *)0x0,0,"No of CI Phones assumed=%d \n",(ulong)(uint)pl->n_ciphone);
  err_msg(ERR_INFO,(char *)0x0,0,"\n");
  return;
}

Assistant:

void
pl_report(pl_t * pl)
{

    E_INFO_NOFN("Initialization of pl_t, report:\n");
    E_INFO_NOFN("Parameters used in phoneme lookahead:\n");
    E_INFO_NOFN("Phoneme look-ahead        type = %d\n", pl->pheurtype);
    E_INFO_NOFN("Phoneme look-ahead beam   size = %d\n", pl->pl_beam);
    E_INFO_NOFN("No of CI Phones assumed=%d \n", pl->n_ciphone);
    E_INFO_NOFN("\n");
}